

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phase.cc
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<double> __l;
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined1 uVar4;
  ostream *poVar5;
  reference pvVar6;
  vector<double,_std::allocator<double>_> *this;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_15;
  ostringstream error_message_14;
  vector<double,_std::allocator<double>_> output_1;
  vector<double,_std::allocator<double>_> waveform;
  int output_length_1;
  ostringstream error_message_13;
  Buffer buffer_1;
  FilterCoefficientsToPhaseSpectrum waveform_to_phase_spectrum;
  istream *input_stream;
  ostringstream error_message_12;
  ifstream ifs;
  char *input_file;
  ostringstream error_message_11;
  int num_input_files_1;
  ostringstream error_message_10;
  ostringstream error_message_9;
  vector<double,_std::allocator<double>_> output;
  int output_length;
  ostringstream error_message_8;
  Buffer buffer;
  FilterCoefficientsToPhaseSpectrum filter_coefficients_to_phase_spectrum;
  istream *input_stream_for_denominator;
  ostringstream error_message_7;
  ifstream ifs_for_denominator;
  istream *input_stream_for_numerator;
  ostringstream error_message_6;
  ifstream ifs_for_numerator;
  ostringstream error_message_5;
  int num_input_files;
  ostringstream error_message_4;
  vector<double,_std::allocator<double>_> denominator_coefficients;
  vector<double,_std::allocator<double>_> numerator_coefficients;
  int denominator_length;
  int numerator_length;
  ostringstream error_message_3;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  bool unwrapping;
  bool is_denominator_specified;
  bool is_numerator_specified;
  char *denominator_coefficients_file;
  char *numerator_coefficients_file;
  int num_denominator_order;
  int num_numerator_order;
  int fft_length;
  option *in_stack_ffffffffffffd9a8;
  Buffer *in_stack_ffffffffffffd9b0;
  undefined7 in_stack_ffffffffffffd9b8;
  undefined1 in_stack_ffffffffffffd9bf;
  allocator *in_stack_ffffffffffffd9c0;
  undefined6 in_stack_ffffffffffffd9c8;
  undefined1 in_stack_ffffffffffffd9ce;
  undefined1 in_stack_ffffffffffffd9cf;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffd9d0;
  int in_stack_ffffffffffffd9d8;
  int in_stack_ffffffffffffd9dc;
  FilterCoefficientsToPhaseSpectrum *in_stack_ffffffffffffd9e0;
  istream *in_stack_ffffffffffffd9e8;
  istream *input_stream_00;
  ostream *in_stack_ffffffffffffd9f0;
  undefined8 in_stack_ffffffffffffd9f8;
  undefined1 *puVar7;
  undefined8 in_stack_ffffffffffffda00;
  allocator *paVar8;
  int *in_stack_ffffffffffffda10;
  int *actual_read_size;
  char *local_25b8;
  bool local_2583;
  bool local_2582;
  Buffer *in_stack_ffffffffffffda88;
  Buffer *buffer_00;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffda90;
  undefined7 in_stack_ffffffffffffda98;
  undefined1 in_stack_ffffffffffffda9f;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffdaa0;
  vector<double,_std::allocator<double>_> *pvVar9;
  undefined7 in_stack_ffffffffffffdaa8;
  undefined1 in_stack_ffffffffffffdaaf;
  char *local_2528;
  bool local_249a;
  bool local_2472;
  allocator *in_stack_ffffffffffffdb98;
  string *in_stack_ffffffffffffdba0;
  undefined1 local_2429 [33];
  ostringstream local_2408 [383];
  allocator local_2289;
  string local_2288 [32];
  ostringstream local_2268 [384];
  undefined8 local_20e8;
  undefined8 *local_20e0;
  undefined8 local_20d8;
  istream local_20b1 [32];
  undefined1 local_2091 [25];
  int local_2078;
  allocator local_2071;
  string local_2070 [32];
  ostringstream local_2050 [536];
  FilterCoefficientsToPhaseSpectrum local_1e38;
  int *local_1db0;
  allocator local_1da1;
  string local_1da0 [32];
  ostringstream local_1d80 [376];
  int local_1c08 [130];
  char *local_1a00;
  allocator local_19f1;
  string local_19f0 [32];
  ostringstream local_19d0 [376];
  int local_1858;
  allocator local_1851;
  string local_1850 [32];
  ostringstream local_1830 [383];
  allocator local_16b1;
  string local_16b0 [32];
  ostringstream local_1690 [383];
  undefined1 local_1511 [33];
  string local_14f0 [32];
  ostringstream local_14d0 [536];
  FilterCoefficientsToPhaseSpectrum local_12b8;
  vector<double,_std::allocator<double>_> *local_1230;
  allocator local_1221;
  string local_1220 [32];
  ostringstream local_1200 [376];
  vector<double,_std::allocator<double>_> local_1088 [21];
  char *local_e80;
  allocator local_e71;
  string local_e70 [32];
  ostringstream local_e50 [376];
  char local_cd8 [527];
  allocator local_ac9;
  string local_ac8 [32];
  ostringstream local_aa8 [380];
  int local_92c;
  int local_928;
  allocator local_921;
  string local_920 [32];
  ostringstream local_900 [384];
  vector<double,_std::allocator<double>_> local_780;
  vector<double,_std::allocator<double>_> local_760;
  int local_744;
  int local_740;
  allocator local_739;
  string local_738 [32];
  ostringstream local_718 [383];
  allocator local_599;
  string local_598 [32];
  ostringstream local_578 [383];
  allocator local_3f9;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [32];
  ostringstream local_3b0 [383];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [32];
  ostringstream local_1e8 [399];
  allocator local_59;
  string local_58 [32];
  int local_38;
  undefined1 local_33;
  byte local_32;
  byte local_31;
  char *local_30;
  char *local_28;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x100;
  local_18 = 0;
  local_1c = 0;
  local_28 = (char *)0x0;
  local_30 = (char *)0x0;
  local_31 = 0;
  local_32 = 0;
  local_33 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_38 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffd9c0 >> 0x20),
                                   (char **)CONCAT17(in_stack_ffffffffffffd9bf,
                                                     in_stack_ffffffffffffd9b8),
                                   (char *)in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8,
                                   (int *)0x1037c5), pcVar1 = ya_optarg, local_38 != -1) {
    switch(local_38) {
    case 0x68:
      anon_unknown.dwarf_1ba2::PrintUsage(in_stack_ffffffffffffd9f0);
      return 0;
    default:
      anon_unknown.dwarf_1ba2::PrintUsage(in_stack_ffffffffffffd9f0);
      return 1;
    case 0x6c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_58,pcVar1,&local_59);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
                         (int *)in_stack_ffffffffffffd9b0);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1e8);
        std::operator<<((ostream *)local_1e8,"The argument for the -l option must be an integer");
        paVar8 = &local_209;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_208,"phase",paVar8);
        sptk::PrintErrorMessage((string *)paVar8,(ostringstream *)in_stack_ffffffffffffdb98);
        std::__cxx11::string::~string(local_208);
        std::allocator<char>::~allocator((allocator<char> *)&local_209);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1e8);
        return local_4;
      }
      break;
    case 0x6d:
      in_stack_ffffffffffffdb98 = &local_231;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_230,pcVar1,in_stack_ffffffffffffdb98);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
                         (int *)in_stack_ffffffffffffd9b0);
      local_2472 = !bVar2 || local_18 < 0;
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
      if (local_2472) {
        std::__cxx11::ostringstream::ostringstream(local_3b0);
        std::operator<<((ostream *)local_3b0,
                        "The argument for the -m option must be a non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3d0,"phase",&local_3d1);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdba0,(ostringstream *)in_stack_ffffffffffffdb98);
        std::__cxx11::string::~string(local_3d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3b0);
        return local_4;
      }
      local_31 = 1;
      break;
    case 0x6e:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f8,pcVar1,&local_3f9);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
                         (int *)in_stack_ffffffffffffd9b0);
      local_249a = !bVar2 || local_1c < 0;
      std::__cxx11::string::~string(local_3f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
      if (local_249a) {
        std::__cxx11::ostringstream::ostringstream(local_578);
        std::operator<<((ostream *)local_578,
                        "The argument for the -n option must be a non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_598,"phase",&local_599);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdba0,(ostringstream *)in_stack_ffffffffffffdb98);
        std::__cxx11::string::~string(local_598);
        std::allocator<char>::~allocator((allocator<char> *)&local_599);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_578);
        return local_4;
      }
      local_32 = 1;
      break;
    case 0x70:
      local_30 = ya_optarg;
      local_32 = 1;
      break;
    case 0x75:
      local_33 = 1;
      break;
    case 0x7a:
      local_28 = ya_optarg;
      local_31 = 1;
    }
  }
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_718);
    std::operator<<((ostream *)local_718,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_738,"phase",&local_739);
    sptk::PrintErrorMessage(in_stack_ffffffffffffdba0,(ostringstream *)in_stack_ffffffffffffdb98);
    std::__cxx11::string::~string(local_738);
    std::allocator<char>::~allocator((allocator<char> *)&local_739);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_718);
    return local_4;
  }
  if (((local_31 & 1) != 0) || ((local_32 & 1) != 0)) {
    local_740 = local_18 + 1;
    local_744 = local_1c + 1;
    std::allocator<double>::allocator((allocator<double> *)0x10407c);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffd9d0,
               CONCAT17(in_stack_ffffffffffffd9cf,
                        CONCAT16(in_stack_ffffffffffffd9ce,in_stack_ffffffffffffd9c8)),
               (allocator_type *)in_stack_ffffffffffffd9c0);
    std::allocator<double>::~allocator((allocator<double> *)0x1040a8);
    std::allocator<double>::allocator((allocator<double> *)0x1040cd);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffd9d0,
               CONCAT17(in_stack_ffffffffffffd9cf,
                        CONCAT16(in_stack_ffffffffffffd9ce,in_stack_ffffffffffffd9c8)),
               (allocator_type *)in_stack_ffffffffffffd9c0);
    std::allocator<double>::~allocator((allocator<double> *)0x1040f9);
    if ((((local_31 & 1) == 0) || ((local_32 & 1) == 0)) ||
       ((local_28 != (char *)0x0 && (local_30 != (char *)0x0)))) {
      local_92c = local_8 - ya_optind;
      if (local_92c < 1) {
        std::ifstream::ifstream(local_cd8);
        pcVar1 = local_28;
        if (((local_31 & 1) == 0) || (local_28 == (char *)0x0)) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_760,0);
          *pvVar6 = 1.0;
LAB_0010460f:
          bVar3 = std::ifstream::is_open();
          if ((bVar3 & 1) == 0) {
            local_2528 = (char *)&std::cin;
          }
          else {
            local_2528 = local_cd8;
          }
          local_e80 = local_2528;
          std::ifstream::ifstream(local_1088);
          pcVar1 = local_30;
          if (((local_32 & 1) == 0) || (local_30 == (char *)0x0)) {
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_780,0);
            *pvVar6 = 1.0;
LAB_0010487e:
            bVar3 = std::ifstream::is_open();
            if ((bVar3 & 1) == 0) {
              pvVar9 = (vector<double,_std::allocator<double>_> *)&std::cin;
            }
            else {
              pvVar9 = local_1088;
            }
            local_1230 = pvVar9;
            sptk::FilterCoefficientsToPhaseSpectrum::FilterCoefficientsToPhaseSpectrum
                      (in_stack_ffffffffffffd9e0,in_stack_ffffffffffffd9dc,in_stack_ffffffffffffd9d8
                       ,(int)((ulong)in_stack_ffffffffffffd9d0 >> 0x20),
                       SUB81((ulong)in_stack_ffffffffffffd9d0 >> 0x18,0));
            sptk::FilterCoefficientsToPhaseSpectrum::Buffer::Buffer(in_stack_ffffffffffffd9b0);
            uVar4 = sptk::FilterCoefficientsToPhaseSpectrum::IsValid(&local_12b8);
            if ((bool)uVar4) {
              local_1511._25_4_ = local_14 / 2 + 1;
              buffer_00 = (Buffer *)local_1511;
              std::allocator<double>::allocator((allocator<double> *)0x104ac8);
              std::vector<double,_std::allocator<double>_>::vector
                        (in_stack_ffffffffffffd9d0,
                         CONCAT17(in_stack_ffffffffffffd9cf,
                                  CONCAT16(in_stack_ffffffffffffd9ce,in_stack_ffffffffffffd9c8)),
                         (allocator_type *)in_stack_ffffffffffffd9c0);
              std::allocator<double>::~allocator((allocator<double> *)0x104af4);
              do {
                if ((local_31 & 1) == 0) {
LAB_00104b4a:
                  local_2583 = true;
                  if ((local_32 & 1) != 0) {
                    local_2583 = sptk::ReadStream<double>
                                           (SUB81((ulong)in_stack_ffffffffffffda00 >> 0x30,0),
                                            (int)in_stack_ffffffffffffda00,
                                            (int)((ulong)in_stack_ffffffffffffd9f8 >> 0x20),
                                            (int)in_stack_ffffffffffffd9f8,
                                            (vector<double,_std::allocator<double>_> *)
                                            in_stack_ffffffffffffd9f0,in_stack_ffffffffffffd9e8,
                                            in_stack_ffffffffffffda10);
                  }
                  local_2582 = local_2583;
                }
                else {
                  bVar2 = sptk::ReadStream<double>
                                    (SUB81((ulong)in_stack_ffffffffffffda00 >> 0x30,0),
                                     (int)in_stack_ffffffffffffda00,
                                     (int)((ulong)in_stack_ffffffffffffd9f8 >> 0x20),
                                     (int)in_stack_ffffffffffffd9f8,
                                     (vector<double,_std::allocator<double>_> *)
                                     in_stack_ffffffffffffd9f0,in_stack_ffffffffffffd9e8,
                                     in_stack_ffffffffffffda10);
                  local_2582 = false;
                  if (bVar2) goto LAB_00104b4a;
                }
                if (local_2582 == false) {
                  local_928 = 0;
                  goto LAB_00104ec7;
                }
                bVar2 = sptk::FilterCoefficientsToPhaseSpectrum::Run
                                  ((FilterCoefficientsToPhaseSpectrum *)
                                   CONCAT17(bVar3,in_stack_ffffffffffffdaa8),pvVar9,
                                   (vector<double,_std::allocator<double>_> *)
                                   CONCAT17(uVar4,in_stack_ffffffffffffda98),
                                   in_stack_ffffffffffffda90,buffer_00);
                if (!bVar2) {
                  std::__cxx11::ostringstream::ostringstream(local_1690);
                  std::operator<<((ostream *)local_1690,
                                  "Failed to transform filter coefficients to phase");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_16b0,"phase",&local_16b1);
                  sptk::PrintErrorMessage
                            (in_stack_ffffffffffffdba0,(ostringstream *)in_stack_ffffffffffffdb98);
                  std::__cxx11::string::~string(local_16b0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_16b1);
                  local_4 = 1;
                  local_928 = 1;
                  std::__cxx11::ostringstream::~ostringstream(local_1690);
                  goto LAB_00104ec7;
                }
                bVar2 = sptk::WriteStream<double>
                                  ((int)in_stack_ffffffffffffda00,
                                   (int)((ulong)in_stack_ffffffffffffd9f8 >> 0x20),
                                   (vector<double,_std::allocator<double>_> *)
                                   in_stack_ffffffffffffd9f0,(ostream *)in_stack_ffffffffffffd9e8,
                                   (int *)in_stack_ffffffffffffd9e0);
              } while (bVar2);
              std::__cxx11::ostringstream::ostringstream(local_1830);
              std::operator<<((ostream *)local_1830,"Failed to write phase");
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1850,"phase",&local_1851);
              sptk::PrintErrorMessage
                        (in_stack_ffffffffffffdba0,(ostringstream *)in_stack_ffffffffffffdb98);
              std::__cxx11::string::~string(local_1850);
              std::allocator<char>::~allocator((allocator<char> *)&local_1851);
              local_4 = 1;
              local_928 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_1830);
LAB_00104ec7:
              std::vector<double,_std::allocator<double>_>::~vector
                        ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd9c0);
            }
            else {
              std::__cxx11::ostringstream::ostringstream(local_14d0);
              std::operator<<((ostream *)local_14d0,
                              "Failed to initialize FilterCoefficientsToPhaseSpectrum");
              paVar8 = (allocator *)(local_1511 + 0x20);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_14f0,"phase",paVar8);
              sptk::PrintErrorMessage
                        (in_stack_ffffffffffffdba0,(ostringstream *)in_stack_ffffffffffffdb98);
              std::__cxx11::string::~string(local_14f0);
              std::allocator<char>::~allocator((allocator<char> *)(local_1511 + 0x20));
              local_4 = 1;
              local_928 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_14d0);
            }
            sptk::FilterCoefficientsToPhaseSpectrum::Buffer::~Buffer(in_stack_ffffffffffffd9b0);
            sptk::FilterCoefficientsToPhaseSpectrum::~FilterCoefficientsToPhaseSpectrum
                      ((FilterCoefficientsToPhaseSpectrum *)0x104eee);
          }
          else {
            std::operator|(_S_in,_S_bin);
            std::ifstream::open((char *)local_1088,(_Ios_Openmode)pcVar1);
            bVar3 = std::ios::fail();
            if ((bVar3 & 1) == 0) goto LAB_0010487e;
            std::__cxx11::ostringstream::ostringstream(local_1200);
            poVar5 = std::operator<<((ostream *)local_1200,"Cannot open file ");
            std::operator<<(poVar5,local_30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1220,"phase",&local_1221);
            sptk::PrintErrorMessage
                      (in_stack_ffffffffffffdba0,(ostringstream *)in_stack_ffffffffffffdb98);
            std::__cxx11::string::~string(local_1220);
            std::allocator<char>::~allocator((allocator<char> *)&local_1221);
            local_4 = 1;
            local_928 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_1200);
          }
          std::ifstream::~ifstream(local_1088);
        }
        else {
          std::operator|(_S_in,_S_bin);
          std::ifstream::open(local_cd8,(_Ios_Openmode)pcVar1);
          bVar3 = std::ios::fail();
          if ((bVar3 & 1) == 0) goto LAB_0010460f;
          std::__cxx11::ostringstream::ostringstream(local_e50);
          poVar5 = std::operator<<((ostream *)local_e50,"Cannot open file ");
          std::operator<<(poVar5,local_28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e70,"phase",&local_e71);
          sptk::PrintErrorMessage
                    (in_stack_ffffffffffffdba0,(ostringstream *)in_stack_ffffffffffffdb98);
          std::__cxx11::string::~string(local_e70);
          std::allocator<char>::~allocator((allocator<char> *)&local_e71);
          local_4 = 1;
          local_928 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_e50);
        }
        std::ifstream::~ifstream(local_cd8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_aa8);
        std::operator<<((ostream *)local_aa8,"Too many input files");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_ac8,"phase",&local_ac9);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdba0,(ostringstream *)in_stack_ffffffffffffdb98);
        std::__cxx11::string::~string(local_ac8);
        std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
        local_4 = 1;
        local_928 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_aa8);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_900);
      std::operator<<((ostream *)local_900,
                      "Numerator and denominator coefficient files are required");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_920,"phase",&local_921);
      sptk::PrintErrorMessage(in_stack_ffffffffffffdba0,(ostringstream *)in_stack_ffffffffffffdb98);
      std::__cxx11::string::~string(local_920);
      std::allocator<char>::~allocator((allocator<char> *)&local_921);
      local_4 = 1;
      local_928 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_900);
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd9c0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd9c0);
    goto joined_r0x00105a0a;
  }
  local_1858 = local_8 - ya_optind;
  if (1 < local_1858) {
    std::__cxx11::ostringstream::ostringstream(local_19d0);
    std::operator<<((ostream *)local_19d0,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_19f0,"phase",&local_19f1);
    sptk::PrintErrorMessage(in_stack_ffffffffffffdba0,(ostringstream *)in_stack_ffffffffffffdb98);
    std::__cxx11::string::~string(local_19f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_19f1);
    local_4 = 1;
    local_928 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_19d0);
    return local_4;
  }
  if (local_1858 == 0) {
    local_25b8 = (char *)0x0;
  }
  else {
    local_25b8 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_1a00 = local_25b8;
  std::ifstream::ifstream(local_1c08);
  pcVar1 = local_1a00;
  if (local_1a00 == (char *)0x0) {
LAB_00105310:
    bVar3 = std::ifstream::is_open();
    if ((bVar3 & 1) == 0) {
      actual_read_size = (int *)&std::cin;
    }
    else {
      actual_read_size = local_1c08;
    }
    local_1db0 = actual_read_size;
    sptk::FilterCoefficientsToPhaseSpectrum::FilterCoefficientsToPhaseSpectrum
              (in_stack_ffffffffffffd9e0,in_stack_ffffffffffffd9dc,in_stack_ffffffffffffd9d8,
               (int)((ulong)in_stack_ffffffffffffd9d0 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffd9d0 >> 0x18,0));
    sptk::FilterCoefficientsToPhaseSpectrum::Buffer::Buffer(in_stack_ffffffffffffd9b0);
    bVar2 = sptk::FilterCoefficientsToPhaseSpectrum::IsValid(&local_1e38);
    if (bVar2) {
      local_2078 = local_14 / 2 + 1;
      pvVar9 = (vector<double,_std::allocator<double>_> *)(long)local_14;
      puVar7 = local_2091;
      std::allocator<double>::allocator((allocator<double> *)0x105531);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_ffffffffffffd9d0,
                 CONCAT17(in_stack_ffffffffffffd9cf,
                          CONCAT16(in_stack_ffffffffffffd9ce,in_stack_ffffffffffffd9c8)),
                 (allocator_type *)in_stack_ffffffffffffd9c0);
      std::allocator<double>::~allocator((allocator<double> *)0x105557);
      this = (vector<double,_std::allocator<double>_> *)(long)local_2078;
      input_stream_00 = local_20b1;
      std::allocator<double>::allocator((allocator<double> *)0x105576);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_ffffffffffffd9d0,
                 CONCAT17(in_stack_ffffffffffffd9cf,
                          CONCAT16(in_stack_ffffffffffffd9ce,in_stack_ffffffffffffd9c8)),
                 (allocator_type *)in_stack_ffffffffffffd9c0);
      std::allocator<double>::~allocator((allocator<double> *)0x10559c);
      do {
        bVar2 = sptk::ReadStream<double>
                          (SUB81((ulong)in_stack_ffffffffffffda00 >> 0x30,0),
                           (int)in_stack_ffffffffffffda00,(int)((ulong)puVar7 >> 0x20),(int)puVar7,
                           pvVar9,input_stream_00,actual_read_size);
        in_stack_ffffffffffffd9dc = CONCAT13(bVar2,(int3)in_stack_ffffffffffffd9dc);
        if (!bVar2) {
          local_928 = 0;
          goto LAB_001059c0;
        }
        local_20e8 = 0x3ff0000000000000;
        local_20e0 = &local_20e8;
        local_20d8 = 1;
        std::allocator<double>::allocator((allocator<double> *)0x10561e);
        __l._M_len = (size_type)pvVar9;
        __l._M_array = (iterator)input_stream_00;
        std::vector<double,_std::allocator<double>_>::vector
                  (this,__l,(allocator_type *)
                            CONCAT44(in_stack_ffffffffffffd9dc,in_stack_ffffffffffffd9d8));
        bVar2 = sptk::FilterCoefficientsToPhaseSpectrum::Run
                          ((FilterCoefficientsToPhaseSpectrum *)
                           CONCAT17(in_stack_ffffffffffffdaaf,in_stack_ffffffffffffdaa8),
                           in_stack_ffffffffffffdaa0,
                           (vector<double,_std::allocator<double>_> *)
                           CONCAT17(in_stack_ffffffffffffda9f,in_stack_ffffffffffffda98),
                           in_stack_ffffffffffffda90,in_stack_ffffffffffffda88);
        bVar3 = bVar2 ^ 0xff;
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd9c0);
        std::allocator<double>::~allocator((allocator<double> *)0x105699);
        if ((bVar3 & 1) != 0) {
          std::__cxx11::ostringstream::ostringstream(local_2268);
          std::operator<<((ostream *)local_2268,"Failed to transform waveform to phase");
          in_stack_ffffffffffffd9c0 = &local_2289;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2288,"phase",in_stack_ffffffffffffd9c0);
          sptk::PrintErrorMessage
                    (in_stack_ffffffffffffdba0,(ostringstream *)in_stack_ffffffffffffdb98);
          std::__cxx11::string::~string(local_2288);
          std::allocator<char>::~allocator((allocator<char> *)&local_2289);
          local_4 = 1;
          local_928 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_2268);
          goto LAB_001059c0;
        }
        bVar2 = sptk::WriteStream<double>
                          ((int)in_stack_ffffffffffffda00,(int)((ulong)puVar7 >> 0x20),pvVar9,
                           (ostream *)input_stream_00,(int *)this);
      } while (bVar2);
      std::__cxx11::ostringstream::ostringstream(local_2408);
      std::operator<<((ostream *)local_2408,"Failed to write phase");
      in_stack_ffffffffffffd9b0 = (Buffer *)local_2429;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_2429 + 1),"phase",(allocator *)in_stack_ffffffffffffd9b0);
      sptk::PrintErrorMessage(in_stack_ffffffffffffdba0,(ostringstream *)in_stack_ffffffffffffdb98);
      std::__cxx11::string::~string((string *)(local_2429 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_2429);
      local_4 = 1;
      local_928 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_2408);
LAB_001059c0:
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd9c0);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd9c0);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_2050);
      std::operator<<((ostream *)local_2050,"Failed to initialize FilterCoefficientsToPhaseSpectrum"
                     );
      paVar8 = &local_2071;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2070,"phase",paVar8);
      sptk::PrintErrorMessage(in_stack_ffffffffffffdba0,(ostringstream *)in_stack_ffffffffffffdb98);
      std::__cxx11::string::~string(local_2070);
      std::allocator<char>::~allocator((allocator<char> *)&local_2071);
      local_4 = 1;
      local_928 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_2050);
    }
    sptk::FilterCoefficientsToPhaseSpectrum::Buffer::~Buffer(in_stack_ffffffffffffd9b0);
    sptk::FilterCoefficientsToPhaseSpectrum::~FilterCoefficientsToPhaseSpectrum
              ((FilterCoefficientsToPhaseSpectrum *)0x1059f4);
  }
  else {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open((char *)local_1c08,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) == 0) goto LAB_00105310;
    std::__cxx11::ostringstream::ostringstream(local_1d80);
    poVar5 = std::operator<<((ostream *)local_1d80,"Cannot open file ");
    std::operator<<(poVar5,local_1a00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1da0,"phase",&local_1da1);
    sptk::PrintErrorMessage(in_stack_ffffffffffffdba0,(ostringstream *)in_stack_ffffffffffffdb98);
    std::__cxx11::string::~string(local_1da0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1da1);
    local_4 = 1;
    local_928 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1d80);
  }
  std::ifstream::~ifstream(local_1c08);
joined_r0x00105a0a:
  if (local_928 == 0) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int fft_length(kDefaultFftLength);
  int num_numerator_order(kDefaultNumNumeratorOrder);
  int num_denominator_order(kDefaultNumDenominatorOrder);
  const char* numerator_coefficients_file(NULL);
  const char* denominator_coefficients_file(NULL);
  bool is_numerator_specified(false);
  bool is_denominator_specified(false);
  bool unwrapping(kDefaultUnwrappingFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:n:z:p:uh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("phase", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_numerator_order) ||
            num_numerator_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("phase", error_message);
          return 1;
        }
        is_numerator_specified = true;
        break;
      }
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &num_denominator_order) ||
            num_denominator_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -n option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("phase", error_message);
          return 1;
        }
        is_denominator_specified = true;
        break;
      }
      case 'z': {
        numerator_coefficients_file = optarg;
        is_numerator_specified = true;
        break;
      }
      case 'p': {
        denominator_coefficients_file = optarg;
        is_denominator_specified = true;
        break;
      }
      case 'u': {
        unwrapping = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("phase", error_message);
    return 1;
  }

  if (is_numerator_specified || is_denominator_specified) {
    const int numerator_length(num_numerator_order + 1);
    const int denominator_length(num_denominator_order + 1);
    std::vector<double> numerator_coefficients(numerator_length);
    std::vector<double> denominator_coefficients(denominator_length);

    if (is_numerator_specified && is_denominator_specified &&
        (NULL == numerator_coefficients_file ||
         NULL == denominator_coefficients_file)) {
      std::ostringstream error_message;
      error_message
          << "Numerator and denominator coefficient files are required";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }

    const int num_input_files(argc - optind);
    if (0 < num_input_files) {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }

    std::ifstream ifs_for_numerator;
    if (is_numerator_specified && NULL != numerator_coefficients_file) {
      ifs_for_numerator.open(numerator_coefficients_file,
                             std::ios::in | std::ios::binary);
      if (ifs_for_numerator.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << numerator_coefficients_file;
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    } else {
      numerator_coefficients[0] = 1.0;
    }
    std::istream& input_stream_for_numerator(
        ifs_for_numerator.is_open() ? ifs_for_numerator : std::cin);

    std::ifstream ifs_for_denominator;
    if (is_denominator_specified && NULL != denominator_coefficients_file) {
      ifs_for_denominator.open(denominator_coefficients_file,
                               std::ios::in | std::ios::binary);
      if (ifs_for_denominator.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << denominator_coefficients_file;
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    } else {
      denominator_coefficients[0] = 1.0;
    }
    std::istream& input_stream_for_denominator(
        ifs_for_denominator.is_open() ? ifs_for_denominator : std::cin);

    sptk::FilterCoefficientsToPhaseSpectrum
        filter_coefficients_to_phase_spectrum(
            num_numerator_order, num_denominator_order, fft_length, unwrapping);
    sptk::FilterCoefficientsToPhaseSpectrum::Buffer buffer;
    if (!filter_coefficients_to_phase_spectrum.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to initialize FilterCoefficientsToPhaseSpectrum";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }

    const int output_length(fft_length / 2 + 1);
    std::vector<double> output(output_length);
    while ((!is_numerator_specified ||
            sptk::ReadStream(false, 0, 0, numerator_length,
                             &numerator_coefficients,
                             &input_stream_for_numerator, NULL)) &&
           (!is_denominator_specified ||
            sptk::ReadStream(false, 0, 0, denominator_length,
                             &denominator_coefficients,
                             &input_stream_for_denominator, NULL))) {
      if (!filter_coefficients_to_phase_spectrum.Run(numerator_coefficients,
                                                     denominator_coefficients,
                                                     &output, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to transform filter coefficients to phase";
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }

      if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write phase";
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    }
  } else {
    const int num_input_files(argc - optind);
    if (1 < num_input_files) {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }
    const char* input_file(0 == num_input_files ? NULL : argv[optind]);

    std::ifstream ifs;
    if (NULL != input_file) {
      ifs.open(input_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << input_file;
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    sptk::FilterCoefficientsToPhaseSpectrum waveform_to_phase_spectrum(
        fft_length - 1, 0, fft_length, unwrapping);
    sptk::FilterCoefficientsToPhaseSpectrum::Buffer buffer;
    if (!waveform_to_phase_spectrum.IsValid()) {
      std::ostringstream error_message;
      error_message << "Failed to initialize FilterCoefficientsToPhaseSpectrum";
      sptk::PrintErrorMessage("phase", error_message);
      return 1;
    }

    const int output_length(fft_length / 2 + 1);
    std::vector<double> waveform(fft_length);
    std::vector<double> output(output_length);
    while (sptk::ReadStream(true, 0, 0, fft_length, &waveform, &input_stream,
                            NULL)) {
      if (!waveform_to_phase_spectrum.Run(waveform, {1}, &output, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to phase";
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }

      if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write phase";
        sptk::PrintErrorMessage("phase", error_message);
        return 1;
      }
    }
  }

  return 0;
}